

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlNewChild(xmlNodePtr parent,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  _xmlNode *p_Var1;
  xmlNodePtr pxVar2;
  uint uVar3;
  _xmlDoc *doc;
  
  if (name != (xmlChar *)0x0 && parent != (xmlNodePtr)0x0) {
    uVar3 = parent->type - XML_ELEMENT_NODE;
    switch(uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f) {
    case 0:
      doc = parent->doc;
      if (ns == (xmlNsPtr)0x0) {
        ns = parent->ns;
      }
      break;
    default:
      goto switchD_0018489f_caseD_1;
    case 4:
    case 6:
      doc = (_xmlDoc *)parent;
      if (ns == (xmlNsPtr)0x0) {
        ns = (xmlNsPtr)0x0;
      }
      break;
    case 5:
      doc = parent->doc;
    }
    pxVar2 = xmlNewDocNode(doc,ns,name,content);
    if (pxVar2 != (xmlNodePtr)0x0) {
      pxVar2->type = XML_ELEMENT_NODE;
      pxVar2->parent = parent;
      pxVar2->doc = parent->doc;
      if (parent->children == (_xmlNode *)0x0) {
        parent->children = pxVar2;
      }
      else {
        p_Var1 = parent->last;
        p_Var1->next = pxVar2;
        pxVar2->prev = p_Var1;
      }
      parent->last = pxVar2;
      return pxVar2;
    }
  }
switchD_0018489f_caseD_1:
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlNewChild(xmlNodePtr parent, xmlNsPtr ns,
            const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur, prev;

    if (parent == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewChild : parent == NULL\n");
#endif
	return(NULL);
    }

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewChild : name == NULL\n");
#endif
	return(NULL);
    }

    /*
     * Allocate a new node
     */
    if (parent->type == XML_ELEMENT_NODE) {
	if (ns == NULL)
	    cur = xmlNewDocNode(parent->doc, parent->ns, name, content);
	else
	    cur = xmlNewDocNode(parent->doc, ns, name, content);
    } else if ((parent->type == XML_DOCUMENT_NODE) ||
	       (parent->type == XML_HTML_DOCUMENT_NODE)) {
	if (ns == NULL)
	    cur = xmlNewDocNode((xmlDocPtr) parent, NULL, name, content);
	else
	    cur = xmlNewDocNode((xmlDocPtr) parent, ns, name, content);
    } else if (parent->type == XML_DOCUMENT_FRAG_NODE) {
	    cur = xmlNewDocNode( parent->doc, ns, name, content);
    } else {
	return(NULL);
    }
    if (cur == NULL) return(NULL);

    /*
     * add the new element at the end of the children list.
     */
    cur->type = XML_ELEMENT_NODE;
    cur->parent = parent;
    cur->doc = parent->doc;
    if (parent->children == NULL) {
        parent->children = cur;
	parent->last = cur;
    } else {
        prev = parent->last;
	prev->next = cur;
	cur->prev = prev;
	parent->last = cur;
    }

    return(cur);
}